

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::InitializeEncoder(Codec *this,uint64_t message_bytes,uint block_bytes)

{
  bool bVar1;
  WirehairResult WVar2;
  uint uVar3;
  undefined4 in_EDX;
  ulong in_RSI;
  uint *in_RDI;
  Codec *in_stack_00000008;
  uint partial_final_bytes;
  WirehairResult result;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  WVar2 = ChooseMatrix((Codec *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (uint)((ulong)in_RDI >> 0x20));
  if (WVar2 == Wirehair_Success) {
    uVar3 = (uint)(in_RSI % (ulong)*in_RDI);
    if (uVar3 == 0) {
      uVar3 = *in_RDI;
    }
    in_RDI[0xe] = uVar3;
    in_RDI[0xf] = *in_RDI;
    *(undefined2 *)(in_RDI + 5) = 0;
    *(undefined1 *)(in_RDI + 0x16) = 0;
    bVar1 = AllocateWorkspace(in_stack_00000008);
    if (!bVar1) {
      WVar2 = Wirehair_OOM;
    }
  }
  return WVar2;
}

Assistant:

WirehairResult Codec::InitializeEncoder(
    uint64_t message_bytes,
    unsigned block_bytes)
{
    WirehairResult result = ChooseMatrix(message_bytes, block_bytes);

    if (result == Wirehair_Success)
    {
        // Calculate partial final bytes
        unsigned partial_final_bytes = message_bytes % _block_bytes;
        if (partial_final_bytes <= 0) {
            partial_final_bytes = _block_bytes;
        }

        // Encoder-specific
        _input_final_bytes = partial_final_bytes;
        _output_final_bytes = _block_bytes;
        _extra_count = 0;
        _original_out_of_order = false;

        if (!AllocateWorkspace()) {
            result = Wirehair_OOM;
        }
    }

    return result;
}